

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int calc_verify_data(void *output,ptls_key_schedule_t *sched,void *secret)

{
  void *in_RDX;
  long in_RSI;
  void *in_RDI;
  ptls_iovec_t pVar1;
  ptls_iovec_t pVar2;
  char *in_stack_00000048;
  size_t in_stack_00000050;
  void *in_stack_00000058;
  int ret;
  uint8_t digest [64];
  ptls_hash_context_t *hmac;
  undefined1 local_68 [64];
  ptls_hash_context_t *local_28;
  long local_18;
  void *local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  pVar1 = ptls_iovec_init(in_RDX,*(size_t *)(*(long *)(in_RSI + 0x58) + 8));
  pVar2 = ptls_iovec_init((void *)0x0,0);
  local_4 = hkdf_expand_label((ptls_hash_algorithm_t *)digest._0_8_,in_stack_00000058,
                              in_stack_00000050,(ptls_iovec_t)digest._8_16_,in_stack_00000048,
                              (ptls_iovec_t)digest._32_16_,(char *)digest._48_8_);
  if (local_4 == 0) {
    local_28 = ptls_hmac_create((ptls_hash_algorithm_t *)pVar1.len,pVar1.base,pVar2.len);
    if (local_28 == (ptls_hash_context_t *)0x0) {
      (*ptls_clear_memory)(local_68,0x40);
      local_4 = 0x201;
    }
    else {
      (**(code **)(*(long *)(local_18 + 0x60) + 8))(*(undefined8 *)(local_18 + 0x60),local_68,2);
      (*local_28->update)(local_28,local_68,*(size_t *)(*(long *)(local_18 + 0x58) + 8));
      (*ptls_clear_memory)(local_68,0x40);
      (*local_28->final)(local_28,local_10,PTLS_HASH_FINAL_MODE_FREE);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int calc_verify_data(void *output, ptls_key_schedule_t *sched, const void *secret)
{
    ptls_hash_context_t *hmac;
    uint8_t digest[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = hkdf_expand_label(sched->hashes[0].algo, digest, sched->hashes[0].algo->digest_size,
                                 ptls_iovec_init(secret, sched->hashes[0].algo->digest_size), "finished", ptls_iovec_init(NULL, 0),
                                 sched->hkdf_label_prefix)) != 0)
        return ret;
    if ((hmac = ptls_hmac_create(sched->hashes[0].algo, digest, sched->hashes[0].algo->digest_size)) == NULL) {
        ptls_clear_memory(digest, sizeof(digest));
        return PTLS_ERROR_NO_MEMORY;
    }

    sched->hashes[0].ctx->final(sched->hashes[0].ctx, digest, PTLS_HASH_FINAL_MODE_SNAPSHOT);
    PTLS_DEBUGF("%s: %02x%02x,%02x%02x\n", __FUNCTION__, ((uint8_t *)secret)[0], ((uint8_t *)secret)[1], digest[0], digest[1]);
    hmac->update(hmac, digest, sched->hashes[0].algo->digest_size);
    ptls_clear_memory(digest, sizeof(digest));
    hmac->final(hmac, output, PTLS_HASH_FINAL_MODE_FREE);

    return 0;
}